

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void DrawTexturePro(Texture2D texture,Rectangle source,Rectangle dest,Vector2 origin,float rotation,
                   Color tint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  
  fVar5 = origin.x;
  fVar7 = origin.y;
  fVar4 = source.width;
  fVar6 = source.height;
  fVar3 = source.x;
  fVar11 = source.y;
  if (texture.id == 0) {
    return;
  }
  fVar10 = fVar4;
  if (fVar4 < 0.0) {
    fVar10 = -fVar4;
  }
  if (fVar6 < 0.0) {
    fVar11 = fVar11 - fVar6;
  }
  fStack_b0 = dest.x;
  fStack_ac = dest.y;
  if ((rotation != 0.0) || (NAN(rotation))) {
    fVar1 = sinf(rotation * 0.017453292);
    fVar2 = cosf(rotation * 0.017453292);
    fVar12 = dest.width - fVar5;
    fVar13 = dest.height - fVar7;
    fVar8 = fVar1 * fVar12 + fStack_ac;
    fVar9 = fVar1 * -fVar5 + fStack_ac;
    fVar12 = fVar2 * fVar12 + fStack_b0;
    fStack_b0 = fVar2 * -fVar5 + fStack_b0;
    local_b8 = -fVar13 * fVar1 + fStack_b0;
    fStack_b4 = -fVar7 * fVar2 + fVar8;
    fStack_b0 = fVar7 * fVar1 + fStack_b0;
    fStack_ac = -fVar7 * fVar2 + fVar9;
    fStack_c4 = fVar2 * fVar13 + fVar8;
    local_c8 = fVar1 * -fVar13 + fVar12;
    fStack_c0 = fVar1 * fVar7 + fVar12;
    fStack_bc = fVar2 * fVar13 + fVar9;
  }
  else {
    fStack_b0 = fStack_b0 - fVar5;
    fStack_ac = fStack_ac - fVar7;
    local_c8 = dest.width + fStack_b0;
    fStack_c4 = dest.height + fStack_ac;
    fStack_c0 = local_c8;
    fStack_bc = fStack_c4;
    local_b8 = fStack_b0;
    fStack_b4 = fStack_ac;
  }
  rlCheckRenderBatchLimit(4);
  rlSetTexture(texture.id);
  rlBegin(7);
  rlColor4ub(tint.r,tint.g,tint.b,tint.a);
  rlNormal3f(0.0,0.0,1.0);
  fVar7 = (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar3 |
                 -(uint)(fVar4 < 0.0) & (uint)(fVar10 + fVar3)) / (float)texture.width;
  fVar5 = fVar11 / (float)texture.height;
  rlTexCoord2f(fVar7,fVar5);
  rlVertex2f(fStack_b0,fStack_ac);
  fVar11 = (fVar6 + fVar11) / (float)texture.height;
  rlTexCoord2f(fVar7,fVar11);
  rlVertex2f(local_b8,fStack_bc);
  if (0.0 <= fVar4) {
    fVar3 = fVar10 + fVar3;
  }
  fVar3 = fVar3 / (float)texture.width;
  rlTexCoord2f(fVar3,fVar11);
  rlVertex2f(local_c8,fStack_c4);
  rlTexCoord2f(fVar3,fVar5);
  rlVertex2f(fStack_c0,fStack_b4);
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawTexturePro(Texture2D texture, Rectangle source, Rectangle dest, Vector2 origin, float rotation, Color tint)
{
    // Check if texture is valid
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        bool flipX = false;

        if (source.width < 0) { flipX = true; source.width *= -1; }
        if (source.height < 0) source.y -= source.height;

        Vector2 topLeft = { 0 };
        Vector2 topRight = { 0 };
        Vector2 bottomLeft = { 0 };
        Vector2 bottomRight = { 0 };

        // Only calculate rotation if needed
        if (rotation == 0.0f)
        {
            float x = dest.x - origin.x;
            float y = dest.y - origin.y;
            topLeft = (Vector2){ x, y };
            topRight = (Vector2){ x + dest.width, y };
            bottomLeft = (Vector2){ x, y + dest.height };
            bottomRight = (Vector2){ x + dest.width, y + dest.height };
        }
        else
        {
            float sinRotation = sinf(rotation*DEG2RAD);
            float cosRotation = cosf(rotation*DEG2RAD);
            float x = dest.x;
            float y = dest.y;
            float dx = -origin.x;
            float dy = -origin.y;

            topLeft.x = x + dx*cosRotation - dy*sinRotation;
            topLeft.y = y + dx*sinRotation + dy*cosRotation;

            topRight.x = x + (dx + dest.width)*cosRotation - dy*sinRotation;
            topRight.y = y + (dx + dest.width)*sinRotation + dy*cosRotation;

            bottomLeft.x = x + dx*cosRotation - (dy + dest.height)*sinRotation;
            bottomLeft.y = y + dx*sinRotation + (dy + dest.height)*cosRotation;

            bottomRight.x = x + (dx + dest.width)*cosRotation - (dy + dest.height)*sinRotation;
            bottomRight.y = y + (dx + dest.width)*sinRotation + (dy + dest.height)*cosRotation;
        }

        rlCheckRenderBatchLimit(4);     // Make sure there is enough free space on the batch buffer

        rlSetTexture(texture.id);
        rlBegin(RL_QUADS);

            rlColor4ub(tint.r, tint.g, tint.b, tint.a);
            rlNormal3f(0.0f, 0.0f, 1.0f);                          // Normal vector pointing towards viewer

            // Top-left corner for texture and quad
            if (flipX) rlTexCoord2f((source.x + source.width)/width, source.y/height);
            else rlTexCoord2f(source.x/width, source.y/height);
            rlVertex2f(topLeft.x, topLeft.y);

            // Bottom-left corner for texture and quad
            if (flipX) rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
            else rlTexCoord2f(source.x/width, (source.y + source.height)/height);
            rlVertex2f(bottomLeft.x, bottomLeft.y);

            // Bottom-right corner for texture and quad
            if (flipX) rlTexCoord2f(source.x/width, (source.y + source.height)/height);
            else rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
            rlVertex2f(bottomRight.x, bottomRight.y);

            // Top-right corner for texture and quad
            if (flipX) rlTexCoord2f(source.x/width, source.y/height);
            else rlTexCoord2f((source.x + source.width)/width, source.y/height);
            rlVertex2f(topRight.x, topRight.y);

        rlEnd();
        rlSetTexture(0);

        // NOTE: Vertex position can be transformed using matrices
        // but the process is way more costly than just calculating
        // the vertex positions manually, like done above.
        // I leave here the old implementation for educational pourposes,
        // just in case someone wants to do some performance test
        /*
        rlSetTexture(texture.id);
        rlPushMatrix();
            rlTranslatef(dest.x, dest.y, 0.0f);
            if (rotation != 0.0f) rlRotatef(rotation, 0.0f, 0.0f, 1.0f);
            rlTranslatef(-origin.x, -origin.y, 0.0f);

            rlBegin(RL_QUADS);
                rlColor4ub(tint.r, tint.g, tint.b, tint.a);
                rlNormal3f(0.0f, 0.0f, 1.0f);                          // Normal vector pointing towards viewer

                // Bottom-left corner for texture and quad
                if (flipX) rlTexCoord2f((source.x + source.width)/width, source.y/height);
                else rlTexCoord2f(source.x/width, source.y/height);
                rlVertex2f(0.0f, 0.0f);

                // Bottom-right corner for texture and quad
                if (flipX) rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
                else rlTexCoord2f(source.x/width, (source.y + source.height)/height);
                rlVertex2f(0.0f, dest.height);

                // Top-right corner for texture and quad
                if (flipX) rlTexCoord2f(source.x/width, (source.y + source.height)/height);
                else rlTexCoord2f((source.x + source.width)/width, (source.y + source.height)/height);
                rlVertex2f(dest.width, dest.height);

                // Top-left corner for texture and quad
                if (flipX) rlTexCoord2f(source.x/width, source.y/height);
                else rlTexCoord2f((source.x + source.width)/width, source.y/height);
                rlVertex2f(dest.width, 0.0f);
            rlEnd();
        rlPopMatrix();
        rlSetTexture(0);
        */
    }
}